

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpp.h
# Opt level: O2

void dts_consume(DataTransferStatsDirection *s,unsigned_long size_consumed)

{
  unsigned_long uVar1;
  
  if (s->running == true) {
    uVar1 = s->remaining - size_consumed;
    if (s->remaining < size_consumed || uVar1 == 0) {
      s->running = false;
      s->expired = true;
      return;
    }
    s->remaining = uVar1;
  }
  return;
}

Assistant:

static inline void dts_consume(struct DataTransferStatsDirection *s,
                               unsigned long size_consumed)
{
    if (s->running) {
        if (s->remaining <= size_consumed) {
            s->running = false;
            s->expired = true;
        } else {
            s->remaining -= size_consumed;
        }
    }
}